

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::SimpleNode::Print(SimpleNode *this,DebugWriter *w,Char *litbuf)

{
  NodeTag NVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16_t *form;
  
  NVar1 = (this->super_Node).tag;
  if (NVar1 == EOL) {
    form = L"EOL";
  }
  else if (NVar1 == BOL) {
    form = L"BOL";
  }
  else {
    if (NVar1 != Empty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x274,"(false)","false");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      goto LAB_00eab18c;
    }
    form = L"Empty";
  }
  DebugWriter::Print(w,form);
LAB_00eab18c:
  DebugWriter::PrintEOL(w,L"()");
  Node::PrintAnnotations(&this->super_Node,w);
  return;
}

Assistant:

void SimpleNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        switch (tag)
        {
        case Empty:
            w->Print(_u("Empty")); break;
        case BOL:
            w->Print(_u("BOL")); break;
        case EOL:
            w->Print(_u("EOL")); break;
        default:
            Assert(false);
        }
        w->PrintEOL(_u("()"));
        PrintAnnotations(w);
    }